

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createArrayLength(Builder *this,Id base,uint member)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *length;
  uint local_18;
  Id intType;
  uint member_local;
  Id base_local;
  Builder *this_local;
  
  local_18 = member;
  intType = base;
  _member_local = this;
  length._4_4_ = makeUintType(this,0x20);
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,length._4_4_,OpArrayLength);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,2);
  spv::Instruction::addIdOperand(local_28,intType);
  spv::Instruction::addImmediateOperand(local_28,local_18);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  addInstruction(this,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  IVar1 = spv::Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createArrayLength(Id base, unsigned int member)
{
    spv::Id intType = makeUintType(32);
    Instruction* length = new Instruction(getUniqueId(), intType, OpArrayLength);
    length->reserveOperands(2);
    length->addIdOperand(base);
    length->addImmediateOperand(member);
    addInstruction(std::unique_ptr<Instruction>(length));

    return length->getResultId();
}